

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontengine.cpp
# Opt level: O2

QFixed kerning(int left,int right,KernPair *pairs,int numPairs)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  uVar3 = left * 0x10000 + right;
  iVar1 = numPairs + -1;
  iVar2 = 0;
  while( true ) {
    if (iVar1 < iVar2) {
      return (QFixed)0;
    }
    iVar4 = (iVar1 - iVar2 >> 1) + iVar2;
    if (pairs[iVar4].left_right == uVar3) break;
    if (pairs[iVar4].left_right < uVar3) {
      iVar2 = iVar4 + 1;
    }
    else {
      iVar1 = iVar4 + -1;
    }
  }
  return (QFixed)pairs[iVar4].adjust.val;
}

Assistant:

static inline QFixed kerning(int left, int right, const QFontEngine::KernPair *pairs, int numPairs)
{
    uint left_right = (left << 16) + right;

    left = 0, right = numPairs - 1;
    while (left <= right) {
        int middle = left + ( ( right - left ) >> 1 );

        if (pairs[middle].left_right == left_right)
            return pairs[middle].adjust;

        if (pairs[middle].left_right < left_right)
            left = middle + 1;
        else
            right = middle - 1;
    }
    return 0;
}